

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3BinHash(void *pKey,int nKey)

{
  char *local_20;
  char *z;
  int h;
  int nKey_local;
  void *pKey_local;
  
  z._0_4_ = 0;
  local_20 = (char *)pKey;
  z._4_4_ = nKey;
  while (0 < z._4_4_) {
    z._0_4_ = (uint)z << 3 ^ (uint)z ^ (int)*local_20;
    local_20 = local_20 + 1;
    z._4_4_ = z._4_4_ + -1;
  }
  return (uint)z & 0x7fffffff;
}

Assistant:

static int fts3BinHash(const void *pKey, int nKey){
  int h = 0;
  const char *z = (const char *)pKey;
  while( nKey-- > 0 ){
    h = (h<<3) ^ h ^ *(z++);
  }
  return h & 0x7fffffff;
}